

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O3

void QTlsBackend::setupClientPskAuth
               (QSslPreSharedKeyAuthenticator *auth,char *hint,int hintLength,uint maxIdentityLen,
               uint maxPskLen)

{
  QArrayData *pQVar1;
  QSslPreSharedKeyAuthenticatorPrivate *pQVar2;
  
  if (hint != (char *)0x0) {
    pQVar2 = (auth->d).d.ptr;
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::detach_helper(&auth->d);
      pQVar2 = (auth->d).d.ptr;
    }
    pQVar1 = &((pQVar2->identityHint).d.d)->super_QArrayData;
    (pQVar2->identityHint).d.d = (Data *)0x0;
    (pQVar2->identityHint).d.ptr = hint;
    (pQVar2->identityHint).d.size = (long)hintLength;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
  }
  pQVar2 = (auth->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::detach_helper(&auth->d);
    pQVar2 = (auth->d).d.ptr;
  }
  pQVar2->maximumIdentityLength = maxIdentityLen - 1;
  if ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::detach_helper(&auth->d);
    pQVar2 = (auth->d).d.ptr;
  }
  pQVar2->maximumPreSharedKeyLength = maxPskLen;
  return;
}

Assistant:

void QTlsBackend::setupClientPskAuth(QSslPreSharedKeyAuthenticator *auth, const char *hint,
                                     int hintLength, unsigned maxIdentityLen, unsigned maxPskLen)
{
    Q_ASSERT(auth);
#if QT_CONFIG(ssl)
    if (hint)
        auth->d->identityHint = QByteArray::fromRawData(hint, hintLength); // it's NUL terminated, but do not include the NUL

    auth->d->maximumIdentityLength = int(maxIdentityLen) - 1; // needs to be NUL terminated
    auth->d->maximumPreSharedKeyLength = int(maxPskLen);
#else
    Q_UNUSED(auth);
    Q_UNUSED(hint);
    Q_UNUSED(hintLength);
    Q_UNUSED(maxIdentityLen);
    Q_UNUSED(maxPskLen);
#endif
}